

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O1

bool __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::IsLinearMapping
          (TPZGeoBlend<pzgeom::TPZGeoLinear> *this,int side)

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  TPZStack<int,_10> LowAllSides;
  TPZManVector<int,_10> local_60;
  
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_60);
  pztopology::TPZLine::LowerDimensionSides(side,(TPZStack<int,_10> *)&local_60);
  if (2 < (uint)side) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
               ,0x28);
  }
  if ((side == 2) && (this->fNeighbours[0].fGeoElIndex != -1)) {
    bVar1 = false;
  }
  else {
    bVar1 = local_60.super_TPZVec<int>.fNElements < 1;
    if (0 < local_60.super_TPZVec<int>.fNElements) {
      lVar2 = 1;
      do {
        if ((1 < (long)local_60.super_TPZVec<int>.fStore[lVar2 + -1]) &&
           ((&this->super_TPZGeoLinear)[(long)local_60.super_TPZVec<int>.fStore[lVar2 + -1] + -1].
            super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes[1] != -1)) break;
        bVar1 = local_60.super_TPZVec<int>.fNElements <= lVar2;
        bVar3 = lVar2 != local_60.super_TPZVec<int>.fNElements;
        lVar2 = lVar2 + 1;
      } while (bVar3);
    }
  }
  TPZManVector<int,_10>::~TPZManVector(&local_60);
  return bVar1;
}

Assistant:

bool pzgeom::TPZGeoBlend<TGeo>::IsLinearMapping(int side) const
{
    TPZStack<int> LowAllSides;
    TGeo::LowerDimensionSides(side,LowAllSides);
    if(side < 0 || side > TGeo::NSides-1)
    {
        DebugStop();
        return 0;
    }
    bool straight = true;
    
    if(side >= TGeo::NNodes && fNeighbours[side-TGeo::NNodes].ElementIndex() != -1)
    {
        straight = false;
        return straight;
    }
    for(int lowside = 0; lowside < LowAllSides.NElements(); lowside++)
    {
        if(LowAllSides[lowside] >= TGeo::NNodes && fNeighbours[LowAllSides[lowside]-TGeo::NNodes].ElementIndex() != -1)
        {
            straight = false;
            return straight;
        }
    }
    return straight;
}